

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_buffer.h
# Opt level: O0

void cio_write_buffer_split_and_append
               (cio_write_buffer *to_head,cio_write_buffer *from_head,cio_write_buffer *wbe)

{
  cio_write_buffer *pcVar1;
  cio_write_buffer *pcVar2;
  cio_write_buffer *pcVar3;
  _Bool _Var4;
  cio_write_buffer *wbe_prev;
  cio_write_buffer *element;
  size_t tail_qlen;
  size_t tail_length;
  cio_write_buffer *from_last;
  cio_write_buffer *to_last;
  cio_write_buffer *wbe_local;
  cio_write_buffer *from_head_local;
  cio_write_buffer *to_head_local;
  
  _Var4 = cio_write_buffer_queue_empty(from_head);
  if (!_Var4) {
    to_last = wbe;
    if (from_head == wbe) {
      to_last = from_head->next;
    }
    pcVar1 = to_head->prev;
    pcVar2 = from_head->prev;
    tail_qlen = 0;
    element = (cio_write_buffer *)0x0;
    for (wbe_prev = to_last; wbe_prev != from_head; wbe_prev = wbe_prev->next) {
      tail_qlen = (wbe_prev->data).element.length + tail_qlen;
      element = (cio_write_buffer *)((long)&element->next + 1);
    }
    pcVar3 = to_last->prev;
    pcVar3->next = from_head;
    from_head->prev = pcVar3;
    (from_head->data).head.q_len = (from_head->data).head.q_len - (long)element;
    (from_head->data).element.length = (from_head->data).element.length - tail_qlen;
    pcVar2->next = to_head;
    to_head->prev = pcVar2;
    pcVar1->next = to_last;
    to_last->prev = pcVar1;
    (to_head->data).head.q_len = (long)&element->next + (to_head->data).head.q_len;
    (to_head->data).element.length = tail_qlen + (to_head->data).element.length;
  }
  return;
}

Assistant:

static inline void cio_write_buffer_split_and_append(struct cio_write_buffer *to_head, struct cio_write_buffer *from_head, struct cio_write_buffer *wbe)
{
	if (cio_unlikely(cio_write_buffer_queue_empty(from_head))) {
		return;
	}

	if (cio_unlikely(from_head == wbe)) {
		wbe = from_head->next;
	}

	struct cio_write_buffer *to_last = to_head->prev;
	struct cio_write_buffer *from_last = from_head->prev;
	size_t tail_length = 0;
	size_t tail_qlen = 0;

	const struct cio_write_buffer *element = wbe;
	while (element != from_head) {
		tail_length += element->data.element.length;
		tail_qlen++;
		element = element->next;
	}

	struct cio_write_buffer *wbe_prev = wbe->prev;
	wbe_prev->next = from_head;
	from_head->prev = wbe_prev;
	from_head->data.head.q_len -= tail_qlen;
	from_head->data.head.total_length -= tail_length;

	from_last->next = to_head;
	to_head->prev = from_last;
	to_last->next = wbe;
	wbe->prev = to_last;
	to_head->data.head.q_len += tail_qlen;
	to_head->data.head.total_length += tail_length;
}